

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::TextureSizeCase::iterate(TextureSizeCase *this)

{
  int iVar1;
  bool bVar2;
  qpTestResult qVar3;
  undefined1 local_4a8 [4];
  int lastIterationIndex;
  TestSize testSizes [36];
  int currentIteration;
  TextureSizeCase *this_local;
  
  iVar1 = this->m_iterationCounter;
  this->m_iterationCounter = iVar1 + 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_4a8,1,2,1);
  testSizes[0].textureSize.m_data[1] = 1;
  testSizes[0].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0].lod,1,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(testSizes[0].expectedSize.m_data + 1),1,2,1);
  testSizes[1].textureSize.m_data[1] = 0;
  testSizes[1].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[1].lod,1,2,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(testSizes[1].expectedSize.m_data + 1),1,3,2);
  testSizes[2].textureSize.m_data[1] = 0;
  testSizes[2].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[2].lod,1,3,2);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(testSizes[2].expectedSize.m_data + 1),1,3,2);
  testSizes[3].textureSize.m_data[1] = 1;
  testSizes[3].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[3].lod,1,1,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[3].expectedSize.m_data + 1),100,0x1f,0x12);
  testSizes[4].textureSize.m_data[1] = 0;
  testSizes[4].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[4].lod,100,0x1f,0x12);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[4].expectedSize.m_data + 1),100,0x1f,0x12);
  testSizes[5].textureSize.m_data[1] = 1;
  testSizes[5].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[5].lod,0x32,0xf,9);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[5].expectedSize.m_data + 1),100,0x1f,0x12);
  testSizes[6].textureSize.m_data[1] = 2;
  testSizes[6].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[6].lod,0x19,7,4);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[6].expectedSize.m_data + 1),100,0x1f,0x12);
  testSizes[7].textureSize.m_data[1] = 3;
  testSizes[7].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[7].lod,0xc,3,2);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[7].expectedSize.m_data + 1),100,0x1f,0x12);
  testSizes[8].textureSize.m_data[1] = 4;
  testSizes[8].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[8].lod,6,1,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[8].expectedSize.m_data + 1),100,0x1f,0x12);
  testSizes[9].textureSize.m_data[1] = 5;
  testSizes[9].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[9].lod,3,1,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[9].expectedSize.m_data + 1),100,0x1f,0x12);
  testSizes[10].textureSize.m_data[1] = 6;
  testSizes[10].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[10].lod,1,1,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[10].expectedSize.m_data + 1),100,0x80,0x20);
  testSizes[0xb].textureSize.m_data[1] = 0;
  testSizes[0xb].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0xb].lod,100,0x80,0x20);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0xb].expectedSize.m_data + 1),100,0x80,0x20);
  testSizes[0xc].textureSize.m_data[1] = 1;
  testSizes[0xc].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0xc].lod,0x32,0x40,0x10);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0xc].expectedSize.m_data + 1),100,0x80,0x20);
  testSizes[0xd].textureSize.m_data[1] = 2;
  testSizes[0xd].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0xd].lod,0x19,0x20,8);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0xd].expectedSize.m_data + 1),100,0x80,0x20);
  testSizes[0xe].textureSize.m_data[1] = 3;
  testSizes[0xe].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0xe].lod,0xc,0x10,4);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0xe].expectedSize.m_data + 1),100,0x80,0x20);
  testSizes[0xf].textureSize.m_data[1] = 4;
  testSizes[0xf].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0xf].lod,6,8,2);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0xf].expectedSize.m_data + 1),100,0x80,0x20);
  testSizes[0x10].textureSize.m_data[1] = 5;
  testSizes[0x10].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x10].lod,3,4,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x10].expectedSize.m_data + 1),100,0x80,0x20);
  testSizes[0x11].textureSize.m_data[1] = 6;
  testSizes[0x11].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x11].lod,1,2,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x11].expectedSize.m_data + 1),100,0x80,0x20);
  testSizes[0x12].textureSize.m_data[1] = 7;
  testSizes[0x12].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x12].lod,1,1,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x12].expectedSize.m_data + 1),0x80,0x40,0x20);
  testSizes[0x13].textureSize.m_data[1] = 0;
  testSizes[0x13].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x13].lod,0x80,0x40,0x20);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x13].expectedSize.m_data + 1),0x80,0x40,0x20);
  testSizes[0x14].textureSize.m_data[1] = 1;
  testSizes[0x14].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x14].lod,0x40,0x20,0x10);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x14].expectedSize.m_data + 1),0x80,0x40,0x20);
  testSizes[0x15].textureSize.m_data[1] = 2;
  testSizes[0x15].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x15].lod,0x20,0x10,8);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x15].expectedSize.m_data + 1),0x80,0x40,0x20);
  testSizes[0x16].textureSize.m_data[1] = 3;
  testSizes[0x16].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x16].lod,0x10,8,4);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x16].expectedSize.m_data + 1),0x80,0x40,0x20);
  testSizes[0x17].textureSize.m_data[1] = 4;
  testSizes[0x17].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x17].lod,8,4,2);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x17].expectedSize.m_data + 1),0x80,0x40,0x20);
  testSizes[0x18].textureSize.m_data[1] = 5;
  testSizes[0x18].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x18].lod,4,2,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x18].expectedSize.m_data + 1),0x80,0x40,0x20);
  testSizes[0x19].textureSize.m_data[1] = 6;
  testSizes[0x19].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x19].lod,2,1,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x19].expectedSize.m_data + 1),0x80,0x40,0x20);
  testSizes[0x1a].textureSize.m_data[1] = 7;
  testSizes[0x1a].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x1a].lod,1,1,1);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(testSizes[0x1a].expectedSize.m_data + 1),1,1,1);
  testSizes[0x1b].textureSize.m_data[1] = 0;
  testSizes[0x1b].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x1b].lod,1,1,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x1b].expectedSize.m_data + 1),0x40,0x40,0x40);
  testSizes[0x1c].textureSize.m_data[1] = 0;
  testSizes[0x1c].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x1c].lod,0x40,0x40,0x40);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x1c].expectedSize.m_data + 1),0x40,0x40,0x40);
  testSizes[0x1d].textureSize.m_data[1] = 1;
  testSizes[0x1d].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x1d].lod,0x20,0x20,0x20);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x1d].expectedSize.m_data + 1),0x40,0x40,0x40);
  testSizes[0x1e].textureSize.m_data[1] = 2;
  testSizes[0x1e].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x1e].lod,0x10,0x10,0x10);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x1e].expectedSize.m_data + 1),0x40,0x40,0x40);
  testSizes[0x1f].textureSize.m_data[1] = 3;
  testSizes[0x1f].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x1f].lod,8,8,8);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x1f].expectedSize.m_data + 1),0x40,0x40,0x40);
  testSizes[0x20].textureSize.m_data[1] = 4;
  testSizes[0x20].textureSize.m_data[2] = 0;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x20].lod,4,4,4);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x20].expectedSize.m_data + 1),100,0x1f,0x12);
  testSizes[0x21].textureSize.m_data[1] = 3;
  testSizes[0x21].textureSize.m_data[2] = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x21].lod,6,1,1);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x21].expectedSize.m_data + 1),0x80,0x40,0x20);
  testSizes[0x22].textureSize.m_data[1] = 3;
  testSizes[0x22].textureSize.m_data[2] = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x22].lod,8,4,2);
  tcu::Vector<int,_3>::Vector
            ((Vector<int,_3> *)(testSizes[0x22].expectedSize.m_data + 1),0x40,0x40,0x40);
  testSizes[0x23].textureSize.m_data[1] = 1;
  testSizes[0x23].textureSize.m_data[2] = 1;
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&testSizes[0x23].lod,0x10,0x10,0x10);
  if (iVar1 == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    bVar2 = initShader(this);
    this_local._4_4_ = (IterateResult)bVar2;
  }
  else if (iVar1 == 0x25) {
    freeShader(this);
    this_local._4_4_ = STOP;
  }
  else {
    bVar2 = testTextureSize(this,(TestSize *)(local_4a8 + (long)(iVar1 + -1) * 0x20));
    if ((!bVar2) &&
       (qVar3 = tcu::TestContext::getTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx),
       qVar3 != QP_TEST_RESULT_FAIL)) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got unexpected texture size");
    }
    this_local._4_4_ = CONTINUE;
  }
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult TextureSizeCase::iterate (void)
{
	const int currentIteration = m_iterationCounter++;
	const TestSize testSizes[] =
	{
		{ tcu::IVec3(1, 2, 1),			1,		0,	tcu::IVec3(1, 1, 1)			},
		{ tcu::IVec3(1, 2, 1),			0,		0,	tcu::IVec3(1, 2, 1)			},

		{ tcu::IVec3(1, 3, 2),			0,		0,	tcu::IVec3(1, 3, 2)			},
		{ tcu::IVec3(1, 3, 2),			1,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(100, 31, 18),		0,		0,	tcu::IVec3(100, 31, 18)		},
		{ tcu::IVec3(100, 31, 18),		1,		0,	tcu::IVec3(50, 15, 9)		},
		{ tcu::IVec3(100, 31, 18),		2,		0,	tcu::IVec3(25, 7, 4)		},
		{ tcu::IVec3(100, 31, 18),		3,		0,	tcu::IVec3(12, 3, 2)		},
		{ tcu::IVec3(100, 31, 18),		4,		0,	tcu::IVec3(6, 1, 1)			},
		{ tcu::IVec3(100, 31, 18),		5,		0,	tcu::IVec3(3, 1, 1)			},
		{ tcu::IVec3(100, 31, 18),		6,		0,	tcu::IVec3(1, 1, 1)			},

		{ tcu::IVec3(100, 128, 32),		0,		0,	tcu::IVec3(100, 128, 32)	},
		{ tcu::IVec3(100, 128, 32),		1,		0,	tcu::IVec3(50, 64, 16)		},
		{ tcu::IVec3(100, 128, 32),		2,		0,	tcu::IVec3(25, 32, 8)		},
		{ tcu::IVec3(100, 128, 32),		3,		0,	tcu::IVec3(12, 16, 4)		},
		{ tcu::IVec3(100, 128, 32),		4,		0,	tcu::IVec3(6, 8, 2)			},
		{ tcu::IVec3(100, 128, 32),		5,		0,	tcu::IVec3(3, 4, 1)			},
		{ tcu::IVec3(100, 128, 32),		6,		0,	tcu::IVec3(1, 2, 1)			},
		{ tcu::IVec3(100, 128, 32),		7,		0,	tcu::IVec3(1, 1, 1)			},

		// pow 2
		{ tcu::IVec3(128, 64, 32),		0,		0,	tcu::IVec3(128, 64, 32)		},
		{ tcu::IVec3(128, 64, 32),		1,		0,	tcu::IVec3(64, 32, 16)		},
		{ tcu::IVec3(128, 64, 32),		2,		0,	tcu::IVec3(32, 16, 8)		},
		{ tcu::IVec3(128, 64, 32),		3,		0,	tcu::IVec3(16, 8, 4)		},
		{ tcu::IVec3(128, 64, 32),		4,		0,	tcu::IVec3(8, 4, 2)			},
		{ tcu::IVec3(128, 64, 32),		5,		0,	tcu::IVec3(4, 2, 1)			},
		{ tcu::IVec3(128, 64, 32),		6,		0,	tcu::IVec3(2, 1, 1)			},
		{ tcu::IVec3(128, 64, 32),		7,		0,	tcu::IVec3(1, 1, 1)			},

		// w == h
		{ tcu::IVec3(1, 1, 1),			0,		0,	tcu::IVec3(1, 1, 1)			},
		{ tcu::IVec3(64, 64, 64),		0,		0,	tcu::IVec3(64, 64, 64)		},
		{ tcu::IVec3(64, 64, 64),		1,		0,	tcu::IVec3(32, 32, 32)		},
		{ tcu::IVec3(64, 64, 64),		2,		0,	tcu::IVec3(16, 16, 16)		},
		{ tcu::IVec3(64, 64, 64),		3,		0,	tcu::IVec3(8, 8, 8)			},
		{ tcu::IVec3(64, 64, 64),		4,		0,	tcu::IVec3(4, 4, 4)			},

		// with lod base
		{ tcu::IVec3(100, 31, 18),		3,		1,	tcu::IVec3(6, 1, 1)			},
		{ tcu::IVec3(128, 64, 32),		3,		1,	tcu::IVec3(8, 4, 2)			},
		{ tcu::IVec3(64, 64, 64),		1,		1,	tcu::IVec3(16, 16, 16)		},

	};
	const int lastIterationIndex = DE_LENGTH_OF_ARRAY(testSizes) + 1;

	if (currentIteration == 0)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return initShader() ? CONTINUE : STOP;
	}
	else if (currentIteration == lastIterationIndex)
	{
		freeShader();
		return STOP;
	}
	else
	{
		if (!testTextureSize(testSizes[currentIteration - 1]))
			if (m_testCtx.getTestResult() != QP_TEST_RESULT_FAIL)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got unexpected texture size");
		return CONTINUE;
	}
}